

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFHelper.h
# Opt level: O1

void __thiscall Assimp::DXF::PolyLine::~PolyLine(PolyLine *this)

{
  pointer pcVar1;
  pointer puVar2;
  pointer paVar3;
  pointer paVar4;
  
  pcVar1 = (this->desc)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->desc).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->layer)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->layer).field_2) {
    operator_delete(pcVar1);
  }
  puVar2 = (this->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  paVar3 = (this->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3);
  }
  paVar4 = (this->positions).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar4 != (pointer)0x0) {
    operator_delete(paVar4);
    return;
  }
  return;
}

Assistant:

PolyLine()
    : flags() {
        // empty
    }